

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int Fax3VGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *local_f0;
  undefined8 *local_d0;
  undefined8 *local_b0;
  undefined8 *local_90;
  undefined8 *local_70;
  undefined8 *local_50;
  Fax3BaseState *sp;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  puVar4 = tif->tif_data;
  if (puVar4 == (uint8_t *)0x0) {
    __assert_fail("sp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_fax3.c"
                  ,0x51d,"int Fax3VGetField(TIFF *, uint32_t, struct __va_list_tag *)");
  }
  if (tag - 0x124 < 2) {
    uVar2 = *(undefined4 *)(puVar4 + 0x20);
    uVar3 = ap->gp_offset;
    if (uVar3 < 0x29) {
      local_90 = (undefined8 *)((long)(int)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      local_90 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_90 + 1;
    }
    *(undefined4 *)*local_90 = uVar2;
  }
  else if (tag == 0x146) {
    uVar2 = *(undefined4 *)(puVar4 + 0x1c);
    uVar3 = ap->gp_offset;
    if (uVar3 < 0x29) {
      local_b0 = (undefined8 *)((long)(int)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      local_b0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_b0 + 1;
    }
    *(undefined4 *)*local_b0 = uVar2;
  }
  else if (tag == 0x147) {
    uVar1 = *(undefined2 *)(puVar4 + 0x14);
    uVar3 = ap->gp_offset;
    if (uVar3 < 0x29) {
      local_d0 = (undefined8 *)((long)(int)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      local_d0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_d0 + 1;
    }
    *(undefined2 *)*local_d0 = uVar1;
  }
  else if (tag == 0x148) {
    uVar2 = *(undefined4 *)(puVar4 + 0x18);
    uVar3 = ap->gp_offset;
    if (uVar3 < 0x29) {
      local_f0 = (undefined8 *)((long)(int)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      local_f0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_f0 + 1;
    }
    *(undefined4 *)*local_f0 = uVar2;
  }
  else if (tag == 0x10000) {
    uVar2 = *(undefined4 *)(puVar4 + 4);
    uVar3 = ap->gp_offset;
    if (uVar3 < 0x29) {
      local_50 = (undefined8 *)((long)(int)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      local_50 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_50 + 1;
    }
    *(undefined4 *)*local_50 = uVar2;
  }
  else {
    if (tag != 0x10004) {
      iVar6 = (**(code **)(puVar4 + 0x28))(tif,tag,ap);
      return iVar6;
    }
    uVar5 = *(undefined8 *)(tif->tif_data + 0x58);
    uVar3 = ap->gp_offset;
    if (uVar3 < 0x29) {
      local_70 = (undefined8 *)((long)(int)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      local_70 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_70 + 1;
    }
    *(undefined8 *)*local_70 = uVar5;
  }
  return 1;
}

Assistant:

static int Fax3VGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    Fax3BaseState *sp = Fax3State(tif);

    assert(sp != 0);

    switch (tag)
    {
        case TIFFTAG_FAXMODE:
            *va_arg(ap, int *) = sp->mode;
            break;
        case TIFFTAG_FAXFILLFUNC:
            *va_arg(ap, TIFFFaxFillFunc *) = DecoderState(tif)->fill;
            break;
        case TIFFTAG_GROUP3OPTIONS:
        case TIFFTAG_GROUP4OPTIONS:
            *va_arg(ap, uint32_t *) = sp->groupoptions;
            break;
        case TIFFTAG_BADFAXLINES:
            *va_arg(ap, uint32_t *) = sp->badfaxlines;
            break;
        case TIFFTAG_CLEANFAXDATA:
            *va_arg(ap, uint16_t *) = sp->cleanfaxdata;
            break;
        case TIFFTAG_CONSECUTIVEBADFAXLINES:
            *va_arg(ap, uint32_t *) = sp->badfaxrun;
            break;
        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
    return (1);
}